

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

int __thiscall QDockAreaLayoutInfo::separatorMove(QDockAreaLayoutInfo *this,int index,int delta)

{
  QDockAreaLayoutInfo *pQVar1;
  bool bVar2;
  int iVar3;
  QDockAreaLayoutItem *this_00;
  qsizetype qVar4;
  const_reference pQVar5;
  QList<QDockAreaLayoutItem> *this_01;
  reference pQVar6;
  reference pQVar7;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QRect QVar8;
  int separatorSpace_1;
  QLayoutStruct *ls_1;
  QDockAreaLayoutItem *item_1;
  int i_1;
  int separatorSpace;
  QLayoutStruct *ls;
  QDockAreaLayoutItem *item;
  int i;
  QList<QLayoutStruct> list;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QList<QDockAreaLayoutItem> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Orientation in_stack_ffffffffffffff64;
  int iVar9;
  Orientation in_stack_ffffffffffffff94;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff98;
  int local_54;
  undefined8 local_40;
  undefined8 local_38;
  Data *local_20;
  QDockAreaLayoutInfo *this_02;
  undefined1 *puVar10;
  QList<QLayoutStruct> *list_00;
  
  list_00 = *(QList<QLayoutStruct> **)(in_FS_OFFSET + 0x28);
  local_20 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  this_02 = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
  puVar10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RDI + 8));
  QList<QLayoutStruct>::QList
            ((QList<QLayoutStruct> *)in_stack_ffffffffffffff50,
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_54 = 0;
  while( true ) {
    this_00 = (QDockAreaLayoutItem *)(long)local_54;
    qVar4 = QList<QLayoutStruct>::size((QList<QLayoutStruct> *)&local_20);
    if (qVar4 <= (long)this_00) break;
    pQVar5 = QList<QDockAreaLayoutItem>::at
                       (in_stack_ffffffffffffff50,
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    in_stack_ffffffffffffff98 =
         (QDockAreaLayoutInfo *)
         QList<QLayoutStruct>::operator[]
                   ((QList<QLayoutStruct> *)in_stack_ffffffffffffff50,
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar2 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (bVar2) {
      *(bool *)((long)&(in_stack_ffffffffffffff98->separatorWidgets).d.ptr + 5) = true;
    }
    else {
      bVar2 = QDockAreaLayoutItem::hasFixedSize(this_00,in_stack_ffffffffffffff64);
      if (bVar2) {
        in_stack_ffffffffffffff64 = 0;
      }
      else {
        in_stack_ffffffffffffff64 = *(Orientation *)*in_RDI;
      }
      *(bool *)((long)&(in_stack_ffffffffffffff98->separatorWidgets).d.ptr + 5) = false;
      *(int *)&(in_stack_ffffffffffffff98->separatorWidgets).d.size = pQVar5->pos;
      *(Orientation *)((long)&(in_stack_ffffffffffffff98->separatorWidgets).d.size + 4) =
           pQVar5->size + in_stack_ffffffffffffff64;
      in_stack_ffffffffffffff5c = *(undefined4 *)((long)in_RDI + 0x24);
      in_stack_ffffffffffffff94 = in_stack_ffffffffffffff64;
      QDockAreaLayoutItem::minimumSize(this_00);
      iVar3 = pick((Orientation)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      *(Orientation *)((long)&(in_stack_ffffffffffffff98->separatorWidgets).d.d + 4) =
           iVar3 + in_stack_ffffffffffffff94;
      QDockAreaLayoutItem::maximumSize(this_00);
      iVar3 = pick((Orientation)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      *(Orientation *)&(in_stack_ffffffffffffff98->separatorWidgets).d.d =
           iVar3 + in_stack_ffffffffffffff94;
    }
    local_54 = local_54 + 1;
  }
  iVar3 = separatorMoveHelper(list_00,(int)((ulong)puVar10 >> 0x20),(int)puVar10,
                              (int)((ulong)this_02 >> 0x20));
  iVar9 = 0;
  while( true ) {
    this_01 = (QList<QDockAreaLayoutItem> *)(long)iVar9;
    qVar4 = QList<QLayoutStruct>::size((QList<QLayoutStruct> *)&local_20);
    if (qVar4 <= (long)this_01) break;
    pQVar6 = QList<QDockAreaLayoutItem>::operator[]
                       (this_01,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar2 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar2) {
      pQVar7 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)this_01,
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      bVar2 = QDockAreaLayoutItem::hasFixedSize(this_00,in_stack_ffffffffffffff64);
      if (bVar2) {
        in_stack_ffffffffffffff4c = 0;
      }
      else {
        in_stack_ffffffffffffff4c = *(int *)*in_RDI;
      }
      pQVar6->size = pQVar7->size - in_stack_ffffffffffffff4c;
      pQVar6->pos = pQVar7->pos;
      if (pQVar6->subinfo != (QDockAreaLayoutInfo *)0x0) {
        QVar8 = itemRect(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         SUB41((uint)iVar9 >> 0x18,0));
        pQVar1 = pQVar6->subinfo;
        local_40 = QVar8._0_8_;
        (pQVar1->rect).x1 = (Representation)(undefined4)local_40;
        (pQVar1->rect).y1 = (Representation)local_40._4_4_;
        local_38 = QVar8._8_8_;
        (pQVar1->rect).x2 = (Representation)(undefined4)local_38;
        (pQVar1->rect).y2 = (Representation)local_38._4_4_;
        fitItems(this_02);
      }
    }
    iVar9 = iVar9 + 1;
  }
  QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x56ff08);
  if (*(QList<QLayoutStruct> **)(in_FS_OFFSET + 0x28) != list_00) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QDockAreaLayoutInfo::separatorMove(int index, int delta)
{
#if QT_CONFIG(tabbar)
    Q_ASSERT(!tabbed);
#endif

    QList<QLayoutStruct> list(item_list.size());
    for (int i = 0; i < list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        QLayoutStruct &ls = list[i];
        Q_ASSERT(!(item.flags & QDockAreaLayoutItem::GapItem));
        if (item.skip()) {
            ls.empty = true;
        } else {
            const int separatorSpace = item.hasFixedSize(o) ? 0 : *sep;
            ls.empty = false;
            ls.pos = item.pos;
            ls.size = item.size + separatorSpace;
            ls.minimumSize = pick(o, item.minimumSize()) + separatorSpace;
            ls.maximumSize = pick(o, item.maximumSize()) + separatorSpace;

        }
    }

    //the separator space has been added to the size, so we pass 0 as a parameter
    delta = separatorMoveHelper(list, index, delta, 0 /*separator*/);

    for (int i = 0; i < list.size(); ++i) {
        QDockAreaLayoutItem &item = item_list[i];
        if (item.skip())
            continue;
        QLayoutStruct &ls = list[i];
        const int separatorSpace = item.hasFixedSize(o) ? 0 : *sep;
        item.size = ls.size - separatorSpace;
        item.pos = ls.pos;
        if (item.subinfo != nullptr) {
            item.subinfo->rect = itemRect(i);
            item.subinfo->fitItems();
        }
    }

    return delta;
}